

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::abc::abc(abc *this,char *name)

{
  data *pdVar1;
  int iVar2;
  undefined4 extraout_var;
  exc *this_00;
  data *pdVar3;
  long lVar4;
  ptr local_58;
  unpolarized local_50;
  value_type ior;
  
  (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)&PTR_eval_001f8560;
  (this->m_fresnel).m_f = (impl *)0x0;
  this->m_data = (data *)0x0;
  lVar4 = 0x65;
  pdVar1 = (data *)&PTR_eval_001f65c0;
  do {
    pdVar3 = pdVar1;
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      this_00 = (exc *)__cxa_allocate_exception(0x28);
      exc::exc(this_00,"djb_error: No ABC parameters for %s\n",name);
      __cxa_throw(this_00,&exc::typeinfo,exc::~exc);
    }
    iVar2 = strcmp(pdVar3[1].name,name);
    pdVar1 = pdVar3 + 1;
  } while (iVar2 != 0);
  this->m_data = pdVar3 + 1;
  local_58.m_f._0_4_ = (float)pdVar3[1].ior;
  brdf_rgb::zero_value((brdf_rgb *)&local_50);
  std::valarray<float>::valarray(&ior,(float *)&local_58,(size_t)local_50.super_impl._vptr_impl);
  operator_delete((void *)local_50.ior._M_size);
  fresnel::unpolarized::unpolarized(&local_50,&ior);
  iVar2 = (**local_50.super_impl._vptr_impl)();
  local_58.m_f = (impl *)CONCAT44(extraout_var,iVar2);
  fresnel::ptr::operator=(&this->m_fresnel,&local_58);
  if (local_58.m_f != (impl *)0x0) {
    (*(local_58.m_f)->_vptr_impl[2])();
  }
  fresnel::unpolarized::~unpolarized(&local_50);
  operator_delete(ior._M_data);
  return;
}

Assistant:

abc::abc(const char *name): m_fresnel(), m_data(NULL)
{
	bool found = false;

	for (int i = 0; i < (int)(sizeof(abc::s_data) / sizeof(abc::data)); ++i) {
		if (!strcmp(s_data[i].name, name)) {
			m_data = &s_data[i];
			brdf::value_type ior(m_data->ior, zero_value().size());
			m_fresnel = fresnel::ptr(fresnel::unpolarized(ior));
			found = true;
			break;
		}
	}
	if (!found) throw exc("djb_error: No ABC parameters for %s\n", name);
}